

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> * __thiscall
Analyser::getFunctionParameter
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,Analyser *this,string *s)

{
  bool bVar1;
  mapped_type *__x;
  Error *this_00;
  allocator<char> local_51;
  string local_50;
  _Self local_30;
  _Self local_28;
  string *local_20;
  string *s_local;
  Analyser *this_local;
  
  local_20 = s;
  s_local = (string *)this;
  this_local = (Analyser *)__return_storage_ptr__;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->_functions,s);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(&this->_functions);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (!bVar1) {
    this_00 = (Error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"function is not exist",&local_51);
    Error::Error(this_00,&local_50,(long)this->_currentLine);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  __x = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
        ::operator[](&this->_functionParameter,local_20);
  std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,__x);
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> Analyser::getFunctionParameter(const std::string& s)
{
	if (_functions.find(s) != _functions.end()) {
		return _functionParameter[s];
	}
	throw Error("function is not exist", _currentLine);
}